

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest04BasicCertificateRevocationTests_::
Section4InvalidRevokedCATest2<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::TestBody
          (Section4InvalidRevokedCATest2<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.4.2";
  local_88.should_validate = false;
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<4ul,3ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_3f4b62_006b5ca0,(char *(*) [4])&PTR_anon_var_dwarf_3f4b94_006b5cc0,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest04BasicCertificateRevocationTests,
                     Section4InvalidRevokedCATest2) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "GoodCACert",
                               "RevokedsubCACert", "InvalidRevokedCATest2EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "GoodCACRL",
                              "RevokedsubCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.4.2";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}